

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

QByteArray * __thiscall
QAuthenticatorPrivate::calculateResponse
          (QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *this,
          QByteArrayView requestMethod,QByteArrayView path,QStringView host)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int *piVar5;
  QAuthenticatorPrivate *pQVar6;
  char acVar7 [8];
  Data *pDVar8;
  char acVar9 [8];
  quint32 qVar10;
  quint16 qVar11;
  quint16 qVar12;
  byte bVar13;
  qsizetype qVar14;
  Data *pDVar15;
  quint32 qVar16;
  char acVar17 [8];
  ushort uVar18;
  int iVar19;
  long lVar20;
  QDataStream *this_00;
  QGssApiHandles *pQVar21;
  gss_name_t pgVar22;
  qsizetype qVar23;
  QArrayData *pQVar24;
  bool bVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  char *pcVar29;
  char16_t *pcVar30;
  undefined8 *puVar31;
  QString *pQVar32;
  undefined1 *puVar33;
  long in_FS_OFFSET;
  QByteArrayView challenge;
  QByteArrayView challenge_00;
  QByteArrayView message;
  QByteArrayView message_00;
  QByteArray ntChallengeResp;
  quint16 avId;
  QByteArray lmChallengeResp;
  QByteArray clientCh;
  QByteArray clientCh_1;
  QByteArray local_360;
  QArrayData *local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  qsizetype local_328;
  storage_type *psStack_320;
  undefined8 local_318;
  char *pcStack_310;
  char local_308 [8];
  undefined8 uStack_300;
  undefined8 local_2f8;
  QByteArray local_2e8;
  QByteArray local_2c8;
  QByteArray local_2a8;
  QByteArray local_288;
  QByteArray local_268;
  QByteArray local_248;
  QByteArray local_228;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  QByteArray local_1e8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  QString local_1c8;
  undefined1 *puStack_1b0;
  QNtlmPhase3Block local_1a8;
  QByteArray local_b8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  int local_98;
  int iStack_94;
  QNtlmBuffer QStack_90;
  QString local_88;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_308[0] = '\0';
  local_308[1] = '\0';
  local_308[2] = '\0';
  local_308[3] = '\0';
  local_308[4] = '\0';
  local_308[5] = '\0';
  local_308[6] = '\0';
  local_308[7] = '\0';
  uStack_300 = 0;
  local_2f8 = 0;
  local_318 = 0;
  pcStack_310 = (char *)0x0;
  switch(this->method) {
  case None:
    goto switchD_001a57a5_caseD_0;
  case Basic:
    local_318 = 5;
    pcStack_310 = "Basic";
    local_1c8.d.size = (qsizetype)&this->password;
    local_1c8.d.ptr = (char16_t *)CONCAT71(local_1c8.d.ptr._1_7_,0x3a);
    local_1c8.d.d = (Data *)this;
    QStringBuilderBase<QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>,_QString>::
    toLatin1(&local_b8,
             (QStringBuilderBase<QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>,_QString>
              *)&local_1c8);
    QByteArray::toBase64(&local_1a8,&local_b8,0);
    acVar7 = local_1a8.magic;
    acVar17 = local_308;
    uVar3 = CONCAT26(local_1a8.lmResponse.maxLen,CONCAT24(local_1a8.lmResponse.len,local_1a8.type));
    local_1a8.magic[0] = local_308[0];
    local_1a8.magic[1] = local_308[1];
    local_1a8.magic[2] = local_308[2];
    local_1a8.magic[3] = local_308[3];
    local_1a8.magic[4] = local_308[4];
    local_1a8.magic[5] = local_308[5];
    local_1a8.magic[6] = local_308[6];
    local_1a8.magic[7] = local_308[7];
    acVar9 = local_1a8.magic;
    local_1a8.magic[0] = acVar7[0];
    local_1a8.magic[1] = acVar7[1];
    local_1a8.magic[2] = acVar7[2];
    local_1a8.magic[3] = acVar7[3];
    local_1a8.magic[4] = acVar7[4];
    local_1a8.magic[5] = acVar7[5];
    local_1a8.magic[6] = acVar7[6];
    local_1a8.magic[7] = acVar7[7];
    local_308[0] = local_1a8.magic[0];
    local_308[1] = local_1a8.magic[1];
    local_308[2] = local_1a8.magic[2];
    local_308[3] = local_1a8.magic[3];
    local_308[4] = local_1a8.magic[4];
    local_308[5] = local_1a8.magic[5];
    local_308[6] = local_1a8.magic[6];
    local_308[7] = local_1a8.magic[7];
    uVar4 = CONCAT26(local_1a8.ntlmResponse.maxLen,
                     CONCAT24(local_1a8.ntlmResponse.len,local_1a8.lmResponse.offset));
    local_1a8.type = (quint32)uStack_300;
    local_1a8.lmResponse.len = (quint16)((ulong)uStack_300 >> 0x20);
    local_1a8.lmResponse.maxLen = (quint16)((ulong)uStack_300 >> 0x30);
    local_1a8.lmResponse.offset = (quint32)local_2f8;
    local_1a8.ntlmResponse.len = (quint16)((ulong)local_2f8 >> 0x20);
    local_1a8.ntlmResponse.maxLen = (quint16)((ulong)local_2f8 >> 0x30);
    uStack_300 = uVar3;
    local_2f8 = uVar4;
    local_1a8.magic = acVar9;
    if (acVar17 != (char  [8])0x0) {
      LOCK();
      *(int *)acVar17 = *(int *)acVar17 + -1;
      UNLOCK();
      if (*(int *)acVar17 == 0) {
        QArrayData::deallocate((QArrayData *)acVar17,1,0x10);
      }
    }
    if ((char  [8])local_b8.d.d != (char  [8])0x0) {
      LOCK();
      *(int *)local_b8.d.d = *(int *)local_b8.d.d + -1;
      iVar19 = *(int *)local_b8.d.d;
      UNLOCK();
      acVar17 = local_1a8.magic;
      acVar7 = (char  [8])local_b8.d.d;
joined_r0x001a58f9:
      local_1a8.magic = acVar17;
      if (iVar19 == 0) {
        QArrayData::deallocate((QArrayData *)acVar7,1,0x10);
      }
    }
    goto switchD_001a57a5_caseD_0;
  case Negotiate:
    local_318 = 9;
    pcStack_310 = "Negotiate";
    if ((this->challenge).d.size == 0) {
      local_1a8.magic[0] = '\0';
      local_1a8.magic[1] = '\0';
      local_1a8.magic[2] = '\0';
      local_1a8.magic[3] = '\0';
      local_1a8.magic[4] = '\0';
      local_1a8.magic[5] = '\0';
      local_1a8.magic[6] = '\0';
      local_1a8.magic[7] = '\0';
      local_1a8.type = 0;
      local_1a8.lmResponse.len = 0;
      local_1a8.lmResponse.maxLen = 0;
      local_1a8.lmResponse.offset = 0;
      local_1a8.ntlmResponse.len = 0;
      local_1a8.ntlmResponse.maxLen = 0;
      if ((this->gssApiHandles).d == (QGssApiHandles *)0x0) {
        pQVar21 = (QGssApiHandles *)operator_new(0x10);
        pQVar21->gssCtx = (gss_ctx_id_t)0x0;
        if (pQVar21 != (QGssApiHandles *)0x0) {
          (this->gssApiHandles).d = pQVar21;
        }
      }
      pgVar22 = qGSsapiGetServiceName(host);
      pQVar21 = (this->gssApiHandles).d;
      if (pgVar22 == (gss_name_t)0x0) {
        if (pQVar21 != (QGssApiHandles *)0x0) {
          (this->gssApiHandles).d = (QGssApiHandles *)0x0;
          operator_delete(pQVar21,0x10);
        }
        local_b8.d.d = (Data *)0x0;
        local_b8.d.ptr._0_4_ = 0;
        local_b8.d.ptr._4_2_ = 0;
        local_b8.d.ptr._6_2_ = 0;
        local_b8.d.size._0_4_ = 0;
        local_b8.d.size._4_4_ = 0;
      }
      else {
        pQVar21->targetName = pgVar22;
        pQVar21->gssCtx = (gss_ctx_id_t)0x0;
        qGssapiContinue(&local_b8,this,(QByteArrayView)ZEXT816(0));
      }
      qVar16 = (quint32)local_b8.d.size;
      pDVar8 = local_b8.d.d;
      qVar12 = local_1a8.lmResponse.maxLen;
      qVar11 = local_1a8.lmResponse.len;
      qVar10 = local_1a8.type;
      acVar17 = local_1a8.magic;
      uVar1 = CONCAT22(local_1a8.ntlmResponse.maxLen,local_1a8.ntlmResponse.len);
      local_b8.d.d = (Data *)local_1a8.magic;
      local_1a8.magic = (char  [8])pDVar8;
      local_1a8.type = (quint32)local_b8.d.ptr;
      local_1a8.lmResponse.len = local_b8.d.ptr._4_2_;
      local_1a8.lmResponse.maxLen = local_b8.d.ptr._6_2_;
      local_b8.d.ptr._0_4_ = qVar10;
      local_b8.d.ptr._4_2_ = qVar11;
      local_b8.d.ptr._6_2_ = qVar12;
      local_b8.d.size._0_4_ = local_1a8.lmResponse.offset;
      local_1a8.lmResponse.offset = qVar16;
      local_1a8.ntlmResponse.len = (quint16)local_b8.d.size._4_4_;
      local_1a8.ntlmResponse.maxLen = (quint16)(local_b8.d.size._4_4_ >> 0x10);
      local_b8.d.size._4_4_ = uVar1;
      if (acVar17 != (char  [8])0x0) {
        LOCK();
        *(int *)acVar17 = *(int *)acVar17 + -1;
        UNLOCK();
        if (*(int *)acVar17 == 0) {
          QArrayData::deallocate((QArrayData *)acVar17,1,0x10);
        }
      }
      lVar20 = CONCAT26(local_1a8.ntlmResponse.maxLen,
                        CONCAT24(local_1a8.ntlmResponse.len,local_1a8.lmResponse.offset));
      if (lVar20 == 0) {
        this->phase = Done;
        QByteArray::QByteArray(__return_storage_ptr__,"",-1);
      }
      else {
        QByteArray::toBase64(&local_b8,&local_1a8,0);
        pDVar8 = local_b8.d.d;
        acVar17 = local_308;
        uVar3 = CONCAT26(local_b8.d.ptr._6_2_,CONCAT24(local_b8.d.ptr._4_2_,(quint32)local_b8.d.ptr)
                        );
        local_b8.d.d = (Data *)local_308;
        local_308 = (char  [8])pDVar8;
        uVar4 = CONCAT44(local_b8.d.size._4_4_,(quint32)local_b8.d.size);
        local_b8.d.ptr._0_4_ = (quint32)uStack_300;
        local_b8.d.ptr._4_2_ = (ushort)((ulong)uStack_300 >> 0x20);
        local_b8.d.ptr._6_2_ = (ushort)((ulong)uStack_300 >> 0x30);
        local_b8.d.size._0_4_ = (quint32)local_2f8;
        local_b8.d.size._4_4_ = (uint)((ulong)local_2f8 >> 0x20);
        uStack_300 = uVar3;
        local_2f8 = uVar4;
        if (acVar17 != (char  [8])0x0) {
          LOCK();
          *(int *)acVar17 = *(int *)acVar17 + -1;
          UNLOCK();
          if (*(int *)acVar17 == 0) {
            QArrayData::deallocate((QArrayData *)acVar17,1,0x10);
          }
        }
        this->phase = Phase2;
      }
      if (local_1a8.magic != (char  [8])0x0) {
        LOCK();
        *(int *)local_1a8.magic = *(int *)local_1a8.magic + -1;
        UNLOCK();
        if (*(int *)local_1a8.magic == 0) {
          QArrayData::deallocate((QArrayData *)local_1a8.magic,1,0x10);
        }
      }
    }
    else {
      local_1a8.magic[0] = '\0';
      local_1a8.magic[1] = '\0';
      local_1a8.magic[2] = '\0';
      local_1a8.magic[3] = '\0';
      local_1a8.magic[4] = '\0';
      local_1a8.magic[5] = '\0';
      local_1a8.magic[6] = '\0';
      local_1a8.magic[7] = '\0';
      local_1a8.type = 0;
      local_1a8.lmResponse.len = 0;
      local_1a8.lmResponse.maxLen = 0;
      local_1a8.lmResponse.offset = 0;
      local_1a8.ntlmResponse.len = 0;
      local_1a8.ntlmResponse.maxLen = 0;
      if ((this->gssApiHandles).d != (QGssApiHandles *)0x0) {
        QByteArray::fromBase64(&local_1c8,&this->challenge,0);
        challenge_00.m_data = (storage_type *)local_1c8.d.ptr;
        challenge_00.m_size = local_1c8.d.size;
        qGssapiContinue(&local_b8,this,challenge_00);
        qVar16 = (quint32)local_b8.d.size;
        pDVar8 = local_b8.d.d;
        qVar12 = local_1a8.lmResponse.maxLen;
        qVar11 = local_1a8.lmResponse.len;
        qVar10 = local_1a8.type;
        acVar17 = local_1a8.magic;
        uVar1 = CONCAT22(local_1a8.ntlmResponse.maxLen,local_1a8.ntlmResponse.len);
        local_b8.d.d = (Data *)local_1a8.magic;
        local_1a8.magic = (char  [8])pDVar8;
        local_1a8.type = (quint32)local_b8.d.ptr;
        local_1a8.lmResponse.len = local_b8.d.ptr._4_2_;
        local_1a8.lmResponse.maxLen = local_b8.d.ptr._6_2_;
        local_b8.d.ptr._0_4_ = qVar10;
        local_b8.d.ptr._4_2_ = qVar11;
        local_b8.d.ptr._6_2_ = qVar12;
        local_b8.d.size._0_4_ = local_1a8.lmResponse.offset;
        local_1a8.lmResponse.offset = qVar16;
        local_1a8.ntlmResponse.len = (quint16)local_b8.d.size._4_4_;
        local_1a8.ntlmResponse.maxLen = (quint16)(local_b8.d.size._4_4_ >> 0x10);
        local_b8.d.size._4_4_ = uVar1;
        if (acVar17 != (char  [8])0x0) {
          LOCK();
          *(int *)acVar17 = *(int *)acVar17 + -1;
          UNLOCK();
          if (*(int *)acVar17 == 0) {
            QArrayData::deallocate((QArrayData *)acVar17,1,0x10);
          }
        }
        if ((QAuthenticatorPrivate *)local_1c8.d.d != (QAuthenticatorPrivate *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      lVar20 = CONCAT26(local_1a8.ntlmResponse.maxLen,
                        CONCAT24(local_1a8.ntlmResponse.len,local_1a8.lmResponse.offset));
      if (lVar20 == 0) {
        this->phase = Done;
        QByteArray::QByteArray(__return_storage_ptr__,"",-1);
      }
      else {
        QByteArray::toBase64(&local_b8,&local_1a8,0);
        pDVar8 = local_b8.d.d;
        acVar17 = local_308;
        uVar3 = CONCAT26(local_b8.d.ptr._6_2_,CONCAT24(local_b8.d.ptr._4_2_,(quint32)local_b8.d.ptr)
                        );
        local_b8.d.d = (Data *)local_308;
        local_308 = (char  [8])pDVar8;
        uVar4 = CONCAT44(local_b8.d.size._4_4_,(quint32)local_b8.d.size);
        local_b8.d.ptr._0_4_ = (quint32)uStack_300;
        local_b8.d.ptr._4_2_ = (ushort)((ulong)uStack_300 >> 0x20);
        local_b8.d.ptr._6_2_ = (ushort)((ulong)uStack_300 >> 0x30);
        local_b8.d.size._0_4_ = (quint32)local_2f8;
        local_b8.d.size._4_4_ = (uint)((ulong)local_2f8 >> 0x20);
        uStack_300 = uVar3;
        local_2f8 = uVar4;
        if (acVar17 != (char  [8])0x0) {
          LOCK();
          *(int *)acVar17 = *(int *)acVar17 + -1;
          UNLOCK();
          if (*(int *)acVar17 == 0) {
            QArrayData::deallocate((QArrayData *)acVar17,1,0x10);
          }
        }
        this->phase = Done;
        QByteArray::operator=(&this->challenge,"");
      }
      if (local_1a8.magic != (char  [8])0x0) {
        LOCK();
        *(int *)local_1a8.magic = *(int *)local_1a8.magic + -1;
        UNLOCK();
        if (*(int *)local_1a8.magic == 0) {
          QArrayData::deallocate((QArrayData *)local_1a8.magic,1,0x10);
        }
      }
    }
    if (lVar20 == 0) goto LAB_001a5945;
    break;
  case Ntlm:
    local_318 = 4;
    pcStack_310 = "NTLM";
    if ((this->challenge).d.size == 0) {
      local_1c8.d.d = (Data *)0x0;
      local_1c8.d.ptr = (char16_t *)0x0;
      local_1c8.d.size = 0;
      local_b8.d.size._0_4_ = 0xaaaaaaaa;
      local_b8.d.size._4_4_ = 0xaaaaaaaa;
      uStack_a0 = 0xaaaaaaaa;
      uStack_9c = 0xaaaaaaaa;
      local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.ptr._0_4_ = 0xaaaaaaaa;
      local_b8.d.ptr._4_2_ = 0xaaaa;
      local_b8.d.ptr._6_2_ = 0xaaaa;
      QDataStream::QDataStream((QDataStream *)&local_b8,&local_1c8,2);
      QDataStream::setByteOrder((ByteOrder)(QDataStream *)&local_b8);
      builtin_strncpy(local_1a8.magic,"NTLMSSP",8);
      local_1a8.type = 1;
      local_1a8.lmResponse.len = 0x8205;
      local_1a8.lmResponse.maxLen = 8;
      local_1a8.lmResponse.offset = 0;
      local_1a8.ntlmResponse.len = 0;
      local_1a8.ntlmResponse.maxLen = 0;
      local_1a8.ntlmResponse.offset = 0;
      local_1a8.domain.len = 0;
      local_1a8.domain.maxLen = 0;
      local_1a8.domain.offset = 0;
      local_1a8.user.len = 0;
      local_1a8.user.maxLen = 0;
      local_1a8.user.offset = 0;
      local_1a8.workstation.len = 0;
      local_1a8.workstation.maxLen = 0;
      local_1a8.workstation.offset = 0;
      local_1a8.sessionKey.len = 0;
      local_1a8.sessionKey.maxLen = 0;
      local_1a8.sessionKey.offset = 0;
      local_1a8.flags._0_1_ = 0;
      local_1a8.flags._1_1_ = 0;
      local_1a8.flags._2_2_ = 0;
      local_1a8.lmResponseBuf.d.d = (Data *)0x0;
      local_1a8.lmResponseBuf.d.ptr = (char *)0x0;
      QDataStream::writeRawData((char *)&local_b8,(longlong)&local_1a8);
      QDataStream::operator<<((QDataStream *)&local_b8,local_1a8.type);
      QDataStream::operator<<
                ((QDataStream *)&local_b8,
                 CONCAT22(local_1a8.lmResponse.maxLen,local_1a8.lmResponse.len));
      ::operator<<((QDataStream *)&local_b8,(QNtlmBuffer *)&local_1a8.lmResponse.offset);
      ::operator<<((QDataStream *)&local_b8,(QNtlmBuffer *)&local_1a8.ntlmResponse.offset);
      if ((CONCAT44(local_1a8.sessionKey._0_4_,local_1a8.workstation.offset) != 0) &&
         (lVar20 = CONCAT44(local_1a8.sessionKey._0_4_,local_1a8.workstation.offset), lVar20 != 0))
      {
        lVar28 = CONCAT44(local_1a8.workstation._0_4_,local_1a8.user.offset);
        lVar27 = 0;
        do {
          QDataStream::operator<<((QDataStream *)&local_b8,*(short *)(lVar28 + lVar27));
          lVar27 = lVar27 + 2;
        } while (lVar20 * 2 != lVar27);
      }
      pDVar8 = local_1a8.lmResponseBuf.d.d;
      if ((local_1a8.lmResponseBuf.d.ptr != (char *)0x0) &&
         (local_1a8.lmResponseBuf.d.ptr != (char *)0x0)) {
        lVar20 = (long)local_1a8.lmResponseBuf.d.ptr * 2;
        lVar28 = 0;
        do {
          QDataStream::operator<<
                    ((QDataStream *)&local_b8,
                     *(short *)((long)&(pDVar8->super_QArrayData).ref_._q_value.
                                       super___atomic_base<int>._M_i + lVar28));
          lVar28 = lVar28 + 2;
        } while (lVar20 != lVar28);
      }
      piVar5 = (int *)CONCAT26(local_1a8.flags._2_2_,
                               CONCAT15(local_1a8.flags._1_1_,
                                        CONCAT14((byte)local_1a8.flags,local_1a8.sessionKey.offset))
                              );
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     CONCAT26(local_1a8.flags._2_2_,
                              CONCAT15(local_1a8.flags._1_1_,
                                       CONCAT14((byte)local_1a8.flags,local_1a8.sessionKey.offset)))
                     ,2,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(local_1a8.user._0_4_,local_1a8.domain.offset);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_1a8.user._0_4_,local_1a8.domain.offset),2,0x10);
        }
      }
      QDataStream::~QDataStream((QDataStream *)&local_b8);
      QByteArray::toBase64(&local_1a8,&local_1c8,0);
      acVar7 = local_1a8.magic;
      acVar17 = local_308;
      uVar3 = CONCAT26(local_1a8.lmResponse.maxLen,CONCAT24(local_1a8.lmResponse.len,local_1a8.type)
                      );
      local_1a8.magic[0] = local_308[0];
      local_1a8.magic[1] = local_308[1];
      local_1a8.magic[2] = local_308[2];
      local_1a8.magic[3] = local_308[3];
      local_1a8.magic[4] = local_308[4];
      local_1a8.magic[5] = local_308[5];
      local_1a8.magic[6] = local_308[6];
      local_1a8.magic[7] = local_308[7];
      acVar9 = local_1a8.magic;
      local_1a8.magic[0] = acVar7[0];
      local_1a8.magic[1] = acVar7[1];
      local_1a8.magic[2] = acVar7[2];
      local_1a8.magic[3] = acVar7[3];
      local_1a8.magic[4] = acVar7[4];
      local_1a8.magic[5] = acVar7[5];
      local_1a8.magic[6] = acVar7[6];
      local_1a8.magic[7] = acVar7[7];
      local_308[0] = local_1a8.magic[0];
      local_308[1] = local_1a8.magic[1];
      local_308[2] = local_1a8.magic[2];
      local_308[3] = local_1a8.magic[3];
      local_308[4] = local_1a8.magic[4];
      local_308[5] = local_1a8.magic[5];
      local_308[6] = local_1a8.magic[6];
      local_308[7] = local_1a8.magic[7];
      uVar4 = CONCAT26(local_1a8.ntlmResponse.maxLen,
                       CONCAT24(local_1a8.ntlmResponse.len,local_1a8.lmResponse.offset));
      local_1a8.type = (quint32)uStack_300;
      local_1a8.lmResponse.len = (quint16)((ulong)uStack_300 >> 0x20);
      local_1a8.lmResponse.maxLen = (quint16)((ulong)uStack_300 >> 0x30);
      local_1a8.lmResponse.offset = (quint32)local_2f8;
      local_1a8.ntlmResponse.len = (quint16)((ulong)local_2f8 >> 0x20);
      local_1a8.ntlmResponse.maxLen = (quint16)((ulong)local_2f8 >> 0x30);
      uStack_300 = uVar3;
      local_2f8 = uVar4;
      local_1a8.magic = acVar9;
      if (acVar17 != (char  [8])0x0) {
        LOCK();
        *(int *)acVar17 = *(int *)acVar17 + -1;
        UNLOCK();
        if (*(int *)acVar17 == 0) {
          QArrayData::deallocate((QArrayData *)acVar17,1,0x10);
        }
      }
      if ((QAuthenticatorPrivate *)local_1c8.d.d != (QAuthenticatorPrivate *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((this->user).d.size == 0) goto switchD_001a57a5_caseD_0;
      this->phase = Phase2;
    }
    else {
      QByteArray::fromBase64(&local_360,&this->challenge,0);
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr._0_4_ = 0xffffffff;
      local_b8.d.ptr._4_2_ = 0;
      local_b8.d.ptr._6_2_ = 0;
      local_b8.d.size._0_4_ = 0;
      local_b8.d.size._4_4_ = 0;
      uStack_a0 = 0;
      uStack_9c = 0;
      local_98 = 0;
      iStack_94 = 0;
      QStack_90.len = 0;
      QStack_90.maxLen = 0;
      QStack_90.offset = 0;
      local_88.d.d._0_4_ = 0;
      local_88.d.d._4_4_ = 0;
      local_88.d.ptr._0_4_ = 0;
      local_88.d.ptr._4_4_ = 0;
      local_88.d.size._0_4_ = 0;
      local_88.d.size._4_4_ = 0;
      uStack_70 = 0;
      uStack_6c = 0;
      local_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      local_58.d.d._0_4_ = 0;
      local_58.d.d._4_4_ = 0;
      local_58.d.ptr._0_4_ = 0;
      local_58.d.ptr._4_4_ = 0;
      local_58.d.size = 0;
      if (CONCAT44(local_360.d.size._4_4_,(uint)local_360.d.size) < 0x30) {
LAB_001a5e1c:
        local_348 = (QArrayData *)0x0;
        uStack_340 = 0;
        local_338 = 0;
      }
      else {
        local_1a8.lmResponse.offset = 0xaaaaaaaa;
        local_1a8.ntlmResponse.len = 0xaaaa;
        local_1a8.ntlmResponse.maxLen = 0xaaaa;
        local_1a8.ntlmResponse.offset = 0xaaaaaaaa;
        local_1a8.domain.len = 0xaaaa;
        local_1a8.domain.maxLen = 0xaaaa;
        local_1a8.magic = (char  [8])&DAT_aaaaaaaaaaaaaaaa;
        local_1a8.type = 0xaaaaaaaa;
        local_1a8.lmResponse.len = 0xaaaa;
        local_1a8.lmResponse.maxLen = 0xaaaa;
        QDataStream::QDataStream((QDataStream *)&local_1a8,&local_360);
        QDataStream::setByteOrder((ByteOrder)&local_1a8);
        lVar20 = QDataStream::readRawData(local_1a8.magic,(longlong)&local_b8);
        if (((lVar20 < 8) || ((char  [8])local_b8.d.d != (char  [8])0x5053534d4c544e)) ||
           (QDataStream::operator>>((QDataStream *)&local_1a8,(int *)&local_b8.d.ptr),
           (quint32)local_b8.d.ptr != 2)) {
LAB_001a5e0f:
          QDataStream::~QDataStream((QDataStream *)&local_1a8);
          goto LAB_001a5e1c;
        }
        operator>>((QDataStream *)&local_1a8,(QNtlmBuffer *)((long)&local_b8.d.ptr + 4));
        QDataStream::operator>>((QDataStream *)&local_1a8,(int *)((long)&local_b8.d.size + 4));
        lVar20 = QDataStream::readRawData(local_1a8.magic,(longlong)&uStack_a0);
        if (lVar20 < 8) goto LAB_001a5e0f;
        this_00 = (QDataStream *)QDataStream::operator>>((QDataStream *)&local_1a8,&local_98);
        QDataStream::operator>>(this_00,&iStack_94);
        operator>>((QDataStream *)&local_1a8,&QStack_90);
        if (local_b8.d.ptr._4_2_ != 0) {
          if (CONCAT44(local_360.d.size._4_4_,(uint)local_360.d.size) <
              (ulong)((quint32)local_b8.d.size + local_b8.d.ptr._4_2_)) goto LAB_001a5e0f;
          QByteArray::mid((longlong)&local_1e8,(longlong)&local_360);
          qStringFromUcs2Le(&local_1c8,&local_1e8);
          pQVar6 = (QAuthenticatorPrivate *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
          pcVar30 = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
          pQVar32 = (QString *)CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
          local_88.d.d._0_4_ = SUB84(local_1c8.d.d,0);
          local_88.d.d._4_4_ = (undefined4)((ulong)local_1c8.d.d >> 0x20);
          local_88.d.ptr._0_4_ = SUB84(local_1c8.d.ptr,0);
          local_88.d.ptr._4_4_ = (undefined4)((ulong)local_1c8.d.ptr >> 0x20);
          local_88.d.size._0_4_ = (undefined4)local_1c8.d.size;
          local_88.d.size._4_4_ = (undefined4)((ulong)local_1c8.d.size >> 0x20);
          local_1c8.d.d = (Data *)pQVar6;
          local_1c8.d.ptr = pcVar30;
          local_1c8.d.size = (qsizetype)pQVar32;
          if (pQVar6 != (QAuthenticatorPrivate *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(pQVar6->user).d.d)->_M_i =
                 ((__atomic_base<int> *)&(pQVar6->user).d.d)->_M_i + -1;
            UNLOCK();
            if (((__atomic_base<int> *)&(pQVar6->user).d.d)->_M_i == 0) {
              QArrayData::deallocate((QArrayData *)pQVar6,2,0x10);
            }
          }
          if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        if (QStack_90.len != 0) {
          if ((uint)local_360.d.size < QStack_90.offset + QStack_90.len) goto LAB_001a5e0f;
          QByteArray::mid((longlong)&local_1c8,(longlong)&local_360);
          qVar23 = local_1c8.d.size;
          pQVar6 = (QAuthenticatorPrivate *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
          pcVar30 = (char16_t *)CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_);
          local_58.d.d._0_4_ = SUB84(local_1c8.d.d,0);
          local_58.d.d._4_4_ = (undefined4)((ulong)local_1c8.d.d >> 0x20);
          local_58.d.ptr._0_4_ = SUB84(local_1c8.d.ptr,0);
          local_58.d.ptr._4_4_ = (undefined4)((ulong)local_1c8.d.ptr >> 0x20);
          local_1c8.d.size = local_58.d.size;
          local_58.d.size = qVar23;
          local_1c8.d.d = (Data *)pQVar6;
          local_1c8.d.ptr = pcVar30;
          if (pQVar6 != (QAuthenticatorPrivate *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(pQVar6->user).d.d)->_M_i =
                 ((__atomic_base<int> *)&(pQVar6->user).d.d)->_M_i + -1;
            UNLOCK();
            if (((__atomic_base<int> *)&(pQVar6->user).d.d)->_M_i == 0) {
              QArrayData::deallocate((QArrayData *)pQVar6,1,0x10);
            }
          }
        }
        QDataStream::~QDataStream((QDataStream *)&local_1a8);
        local_348 = (QArrayData *)0x0;
        uStack_340 = 0;
        local_338 = 0;
        local_1f8 = 0xaaaaaaaa;
        uStack_1f4 = 0xaaaaaaaa;
        uStack_1f0 = 0xaaaaaaaa;
        uStack_1ec = 0xaaaaaaaa;
        local_208 = 0xaaaaaaaa;
        uStack_204 = 0xaaaaaaaa;
        uStack_200 = 0xaaaaaaaa;
        uStack_1fc = 0xaaaaaaaa;
        QDataStream::QDataStream((QDataStream *)&local_208,&local_348,2);
        QDataStream::setByteOrder((ByteOrder)(QDataStream *)&local_208);
        memset(&local_1a8,0xaa,0xe8);
        builtin_strncpy(local_1a8.magic,"NTLMSSP",8);
        local_1a8.type = 3;
        local_1a8.lmResponse.len = 0;
        local_1a8.lmResponse.maxLen = 0;
        local_1a8.lmResponse.offset = 0;
        local_1a8.ntlmResponse.len = 0;
        local_1a8.ntlmResponse.maxLen = 0;
        local_1a8.ntlmResponse.offset = 0;
        local_1a8.domain.len = 0;
        local_1a8.domain.maxLen = 0;
        local_1a8.domain.offset = 0;
        local_1a8.user.len = 0;
        local_1a8.user.maxLen = 0;
        local_1a8.user.offset = 0;
        local_1a8.workstation.len = 0;
        local_1a8.workstation.maxLen = 0;
        local_1a8.workstation.offset = 0;
        local_1a8.sessionKey.len = 0;
        local_1a8.sessionKey.maxLen = 0;
        local_1a8.sessionKey.offset = 0;
        local_1a8.flags._0_1_ = 1;
        local_1a8.flags._1_1_ = 2;
        local_1a8.flags._2_2_ = 0x80;
        memset(&local_1a8.lmResponseBuf,0,0xa8);
        if ((local_b8.d.size._4_4_ >> 0x13 & 1) != 0) {
          local_1a8.flags._0_1_ = 1;
          local_1a8.flags._1_1_ = 2;
          local_1a8.flags._2_2_ = 0x88;
        }
        if ((short)local_b8.d.size._4_4_ < 0) {
          local_1a8.flags._1_1_ = local_1a8.flags._1_1_ | 0x80;
        }
        uVar26 = local_b8.d.size._4_4_ & 1;
        uVar1 = CONCAT22(local_1a8.flags._2_2_,CONCAT11(local_1a8.flags._1_1_,(byte)local_1a8.flags)
                        ) | 2 - uVar26;
        local_1a8.flags._0_1_ = (byte)uVar1;
        local_1a8.flags._1_1_ = (byte)(uVar1 >> 8);
        local_1a8.flags._2_2_ = (undefined2)(uVar1 >> 0x10);
        if ((this->userDomain).d.size == 0) {
          local_1c8.d.ptr = (this->extractedUser).d.ptr;
          local_1c8.d.d = (Data *)(this->extractedUser).d.size;
          qVar23 = QStringView::indexOf((QStringView *)&local_1c8,(QChar)0x40,0,CaseSensitive);
          if (qVar23 != -1) goto LAB_001a65c9;
          pQVar32 = &local_88;
        }
        else {
LAB_001a65c9:
          pQVar32 = &this->userDomain;
        }
        bVar25 = SUB41(uVar26,0);
        iVar19 = qEncodeNtlmString(&local_1a8.domain,0x40,pQVar32,bVar25);
        QString::operator=(&local_1a8.domainStr,(QString *)pQVar32);
        iVar19 = qEncodeNtlmString(&local_1a8.user,iVar19,&this->extractedUser,bVar25);
        QString::operator=(&local_1a8.userStr,(QString *)&this->extractedUser);
        iVar19 = qEncodeNtlmString(&local_1a8.workstation,iVar19,&this->workstation,bVar25);
        QString::operator=(&local_1a8.workstationStr,(QString *)&this->workstation);
        pQVar24 = &(local_1a8.lmResponseBuf.d.d)->super_QArrayData;
        if (QStack_90.len == 0) {
          qCreatev2Hash((QByteArray *)&local_1c8,this,&local_1a8);
          if ((QAuthenticatorPrivate *)local_1c8.d.d != (QAuthenticatorPrivate *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,1,0x10);
            }
          }
          local_1e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_1e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1e8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray(&local_1e8,(char *)&uStack_a0,8);
          local_228.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::right(&local_228,&this->cnonce,8);
          QByteArray::append(&local_1e8);
          local_248.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_248.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          local_248.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          message.m_data = local_1e8.d.ptr;
          message.m_size = local_1e8.d.size;
          qEncodeHmacMd5(&local_248,&local_1a8.v2Hash,message);
          QByteArray::append(&local_248);
          if (&(local_228.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,0x10);
            }
          }
          qVar14 = local_1a8.lmResponseBuf.d.size;
          pcVar29 = local_1a8.lmResponseBuf.d.ptr;
          pQVar24 = &(local_1a8.lmResponseBuf.d.d)->super_QArrayData;
          qVar23 = local_248.d.size;
          local_1a8.lmResponseBuf.d.ptr = local_248.d.ptr;
          pDVar8 = local_248.d.d;
          local_248.d.d = local_1a8.lmResponseBuf.d.d;
          local_1a8.lmResponseBuf.d.d = pDVar8;
          local_248.d.ptr = pcVar29;
          local_248.d.size = local_1a8.lmResponseBuf.d.size;
          local_1a8.lmResponseBuf.d.size = qVar23;
          if (pQVar24 != (QArrayData *)0x0) {
            LOCK();
            (((Data *)pQVar24)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (((Data *)pQVar24)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            iVar2 = (((Data *)pQVar24)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i;
            UNLOCK();
            local_248.d.d = (Data *)pQVar24;
            local_248.d.size = qVar14;
            goto joined_r0x001a682a;
          }
        }
        else {
          local_1a8.lmResponseBuf.d.d = (Data *)0x0;
          local_1a8.lmResponseBuf.d.ptr = (char *)0x0;
          local_1a8.lmResponseBuf.d.size = 0;
          if (pQVar24 != (QArrayData *)0x0) {
            LOCK();
            (((Data *)pQVar24)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (((Data *)pQVar24)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            iVar2 = (((Data *)pQVar24)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i;
            UNLOCK();
joined_r0x001a682a:
            if (iVar2 == 0) {
              QArrayData::deallocate(pQVar24,1,0x10);
            }
          }
        }
        uVar18 = (ushort)local_1a8.lmResponseBuf.d.size;
        local_1a8.lmResponse.offset = iVar19 + 1U & 0xfffffffe;
        local_1a8.lmResponse.len = uVar18;
        local_1a8.lmResponse.maxLen = uVar18;
        qCreatev2Hash(&local_228,this,&local_1a8);
        if (&(local_228.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,1,0x10);
          }
        }
        local_248.d.d = (Data *)0x0;
        local_248.d.ptr = (char *)0x0;
        local_248.d.size = 0;
        local_1e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        uStack_1d0 = 0xaaaaaaaa;
        uStack_1cc = 0xaaaaaaaa;
        local_1e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1e8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QDataStream::QDataStream((QDataStream *)&local_1e8,&local_248,2);
        QDataStream::setByteOrder((ByteOrder)(QDataStream *)&local_1e8);
        QDataStream::operator<<((QDataStream *)&local_1e8,1);
        QDataStream::operator<<((QDataStream *)&local_1e8,1);
        local_268.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_268.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_268.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        puVar33 = (undefined1 *)0x0;
        QByteArray::QByteArray(&local_268,6,'\0');
        pcVar29 = local_268.d.ptr;
        if (local_268.d.ptr == (char *)0x0) {
          pcVar29 = (char *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar29);
        if (QStack_90.len == 0) {
          pcVar29 = (char *)0x0;
          pQVar24 = (QArrayData *)0x0;
        }
        else {
          local_288.d.d = (Data *)0x0;
          local_288.d.ptr = (char *)0x0;
          local_288.d.size = 0;
          local_1c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QDataStream::QDataStream((QDataStream *)&local_1c8,&local_58);
          QDataStream::setByteOrder((ByteOrder)(QDataStream *)&local_1c8);
          local_2a8.d.d = (Data *)CONCAT62(local_2a8.d.d._2_6_,0xaaaa);
          local_2c8.d.d = (Data *)CONCAT62(local_2c8.d.d._2_6_,0xaaaa);
          while( true ) {
            QDataStream::operator>>((QDataStream *)&local_1c8,(short *)&local_2a8);
            QDataStream::operator>>((QDataStream *)&local_1c8,(short *)&local_2c8);
            if ((short)local_2a8.d.d == 0) break;
            if ((short)local_2a8.d.d == 7) {
              QByteArray::resize((longlong)&local_288);
              if ((&(local_288.d.d)->super_QArrayData == (QArrayData *)0x0) ||
                 (1 < ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i)) {
                QByteArray::reallocData((longlong)&local_288,(AllocationOption)local_288.d.size);
              }
              QDataStream::readRawData((char *)&local_1c8,(longlong)local_288.d.ptr);
              break;
            }
            QDataStream::skipRawData((longlong)&local_1c8);
          }
          QDataStream::~QDataStream((QDataStream *)&local_1c8);
          pQVar24 = &(local_288.d.d)->super_QArrayData;
          pcVar29 = local_288.d.ptr;
          puVar33 = (undefined1 *)local_288.d.size;
        }
        if (puVar33 == (undefined1 *)0x0) {
          lVar20 = QDateTime::currentSecsSinceEpoch();
          QDataStream::operator<<((QDataStream *)&local_1e8,lVar20 * 10000000 + 0x19db1ded53e8000);
        }
        else {
          if (pcVar29 == (char *)0x0) {
            pcVar29 = (char *)&QByteArray::_empty;
          }
          QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar29);
        }
        local_1c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QByteArray::right((QByteArray *)&local_1c8,&this->cnonce,8);
        pcVar30 = local_1c8.d.ptr;
        if (local_1c8.d.ptr == (char16_t *)0x0) {
          pcVar30 = (char16_t *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar30);
        local_288.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_288.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_288.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&local_288,4,'\0');
        pcVar29 = local_288.d.ptr;
        if (local_288.d.ptr == (char *)0x0) {
          pcVar29 = (char *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar29);
        if (QStack_90.len != 0) {
          puVar31 = (undefined8 *)CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_);
          if (puVar31 == (undefined8 *)0x0) {
            puVar31 = &QByteArray::_empty;
          }
          QDataStream::writeRawData((char *)&local_1e8,(longlong)puVar31);
        }
        local_2a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_2a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_2a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&local_2a8,4,'\0');
        pcVar29 = local_2a8.d.ptr;
        if (local_2a8.d.ptr == (char *)0x0) {
          pcVar29 = (char *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_1e8,(longlong)pcVar29);
        local_2c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_2c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_2c8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&local_2c8,(char *)&uStack_a0,8);
        QByteArray::append(&local_2c8);
        local_2e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_2e8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_2e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        message_00.m_data = local_2c8.d.ptr;
        message_00.m_size = local_2c8.d.size;
        qEncodeHmacMd5(&local_2e8,&local_1a8.v2Hash,message_00);
        QByteArray::append(&local_2e8);
        if (&(local_2c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_2c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_2c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_2c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_2c8.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_2a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_2a8.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_288.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,1,0x10);
          }
        }
        if ((QAuthenticatorPrivate *)local_1c8.d.d != (QAuthenticatorPrivate *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_1c8.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (pQVar24 != (QArrayData *)0x0) {
          LOCK();
          (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar24,1,0x10);
          }
        }
        if (&(local_268.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_268.d.d)->super_QArrayData,1,0x10);
          }
        }
        QDataStream::~QDataStream((QDataStream *)&local_1e8);
        if (&(local_248.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_248.d.d)->super_QArrayData,1,0x10);
          }
        }
        pcVar29 = local_1a8.ntlmResponseBuf.d.ptr;
        pDVar15 = local_1a8.ntlmResponseBuf.d.d;
        qVar23 = local_2e8.d.size;
        pDVar8 = local_2e8.d.d;
        local_2e8.d.d = local_1a8.ntlmResponseBuf.d.d;
        local_1a8.ntlmResponseBuf.d.d = pDVar8;
        local_1a8.ntlmResponseBuf.d.ptr = local_2e8.d.ptr;
        local_2e8.d.ptr = pcVar29;
        local_2e8.d.size = local_1a8.ntlmResponseBuf.d.size;
        local_1a8.ntlmResponseBuf.d.size = qVar23;
        if (&pDVar15->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar15->super_QArrayData,1,0x10);
          }
        }
        bVar13 = (byte)local_1a8.flags;
        local_1a8.ntlmResponse.len = (quint16)local_1a8.ntlmResponseBuf.d.size;
        local_1a8.ntlmResponse.maxLen = (quint16)local_1a8.ntlmResponseBuf.d.size;
        local_1a8.ntlmResponse.offset = (uint)uVar18 + (iVar19 + 1U | 1) & 0xfffffffe;
        QDataStream::writeRawData((char *)&local_208,(longlong)&local_1a8);
        QDataStream::operator<<((QDataStream *)&local_208,local_1a8.type);
        ::operator<<((QDataStream *)&local_208,&local_1a8.lmResponse);
        ::operator<<((QDataStream *)&local_208,&local_1a8.ntlmResponse);
        ::operator<<((QDataStream *)&local_208,&local_1a8.domain);
        ::operator<<((QDataStream *)&local_208,&local_1a8.user);
        ::operator<<((QDataStream *)&local_208,&local_1a8.workstation);
        ::operator<<((QDataStream *)&local_208,&local_1a8.sessionKey);
        QDataStream::operator<<
                  ((QDataStream *)&local_208,
                   CONCAT22(local_1a8.flags._2_2_,
                            CONCAT11(local_1a8.flags._1_1_,(byte)local_1a8.flags)));
        if (local_1a8.domainStr.d.size != 0) {
          qStreamNtlmString((QDataStream *)&local_208,&local_1a8.domainStr,(bool)(bVar13 & 1));
        }
        bVar25 = (bool)(bVar13 & 1);
        qStreamNtlmString((QDataStream *)&local_208,&local_1a8.userStr,bVar25);
        if (local_1a8.workstationStr.d.size != 0) {
          qStreamNtlmString((QDataStream *)&local_208,&local_1a8.workstationStr,bVar25);
        }
        pcVar29 = local_1a8.lmResponseBuf.d.ptr;
        if (local_1a8.lmResponseBuf.d.ptr == (char *)0x0) {
          pcVar29 = (char *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_208,(longlong)pcVar29);
        pcVar29 = local_1a8.ntlmResponseBuf.d.ptr;
        if (local_1a8.ntlmResponseBuf.d.ptr == (char *)0x0) {
          pcVar29 = (char *)&QByteArray::_empty;
        }
        QDataStream::writeRawData((char *)&local_208,(longlong)pcVar29);
        QNtlmPhase3Block::~QNtlmPhase3Block(&local_1a8);
        QDataStream::~QDataStream((QDataStream *)&local_208);
      }
      piVar5 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),1,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(uStack_6c,uStack_70);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,uStack_70),2,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
        }
      }
      QByteArray::toBase64(&local_1a8,&local_348,0);
      acVar7 = local_1a8.magic;
      acVar17 = local_308;
      uVar3 = CONCAT26(local_1a8.lmResponse.maxLen,CONCAT24(local_1a8.lmResponse.len,local_1a8.type)
                      );
      local_1a8.magic[0] = local_308[0];
      local_1a8.magic[1] = local_308[1];
      local_1a8.magic[2] = local_308[2];
      local_1a8.magic[3] = local_308[3];
      local_1a8.magic[4] = local_308[4];
      local_1a8.magic[5] = local_308[5];
      local_1a8.magic[6] = local_308[6];
      local_1a8.magic[7] = local_308[7];
      acVar9 = local_1a8.magic;
      local_1a8.magic[0] = acVar7[0];
      local_1a8.magic[1] = acVar7[1];
      local_1a8.magic[2] = acVar7[2];
      local_1a8.magic[3] = acVar7[3];
      local_1a8.magic[4] = acVar7[4];
      local_1a8.magic[5] = acVar7[5];
      local_1a8.magic[6] = acVar7[6];
      local_1a8.magic[7] = acVar7[7];
      local_308[0] = local_1a8.magic[0];
      local_308[1] = local_1a8.magic[1];
      local_308[2] = local_1a8.magic[2];
      local_308[3] = local_1a8.magic[3];
      local_308[4] = local_1a8.magic[4];
      local_308[5] = local_1a8.magic[5];
      local_308[6] = local_1a8.magic[6];
      local_308[7] = local_1a8.magic[7];
      uVar4 = CONCAT26(local_1a8.ntlmResponse.maxLen,
                       CONCAT24(local_1a8.ntlmResponse.len,local_1a8.lmResponse.offset));
      local_1a8.type = (quint32)uStack_300;
      local_1a8.lmResponse.len = (quint16)((ulong)uStack_300 >> 0x20);
      local_1a8.lmResponse.maxLen = (quint16)((ulong)uStack_300 >> 0x30);
      local_1a8.lmResponse.offset = (quint32)local_2f8;
      local_1a8.ntlmResponse.len = (quint16)((ulong)local_2f8 >> 0x20);
      local_1a8.ntlmResponse.maxLen = (quint16)((ulong)local_2f8 >> 0x30);
      uStack_300 = uVar3;
      local_2f8 = uVar4;
      local_1a8.magic = acVar9;
      if (acVar17 != (char  [8])0x0) {
        LOCK();
        *(int *)acVar17 = *(int *)acVar17 + -1;
        UNLOCK();
        if (*(int *)acVar17 == 0) {
          QArrayData::deallocate((QArrayData *)acVar17,1,0x10);
        }
      }
      if (local_348 != (QArrayData *)0x0) {
        LOCK();
        (local_348->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_348->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_348->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_348,1,0x10);
        }
      }
      if (&(local_360.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_360.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_360.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_360.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_360.d.d)->super_QArrayData,1,0x10);
        }
      }
      this->phase = Done;
      QByteArray::operator=(&this->challenge,"");
    }
    break;
  case DigestMd5:
    local_318 = 6;
    pcStack_310 = "Digest";
    challenge.m_data = (this->challenge).d.ptr;
    challenge.m_size = (this->challenge).d.size;
    local_328 = path.m_size;
    psStack_320 = path.m_data;
    digestMd5Response((QByteArray *)&local_1a8,this,challenge,requestMethod,path);
    acVar17 = local_308;
    uVar3 = CONCAT26(local_1a8.lmResponse.maxLen,CONCAT24(local_1a8.lmResponse.len,local_1a8.type));
    local_308[0] = local_1a8.magic[0];
    local_308[1] = local_1a8.magic[1];
    local_308[2] = local_1a8.magic[2];
    local_308[3] = local_1a8.magic[3];
    local_308[4] = local_1a8.magic[4];
    local_308[5] = local_1a8.magic[5];
    local_308[6] = local_1a8.magic[6];
    local_308[7] = local_1a8.magic[7];
    uVar4 = CONCAT26(local_1a8.ntlmResponse.maxLen,
                     CONCAT24(local_1a8.ntlmResponse.len,local_1a8.lmResponse.offset));
    local_1a8.type = (quint32)uStack_300;
    local_1a8.lmResponse.len = (quint16)((ulong)uStack_300 >> 0x20);
    local_1a8.lmResponse.maxLen = (quint16)((ulong)uStack_300 >> 0x30);
    local_1a8.lmResponse.offset = (quint32)local_2f8;
    local_1a8.ntlmResponse.len = (quint16)((ulong)local_2f8 >> 0x20);
    local_1a8.ntlmResponse.maxLen = (quint16)((ulong)local_2f8 >> 0x30);
    uStack_300 = uVar3;
    local_2f8 = uVar4;
    if (acVar17 != (char  [8])0x0) {
      LOCK();
      *(int *)acVar17 = *(int *)acVar17 + -1;
      iVar19 = *(int *)acVar17;
      UNLOCK();
      local_308 = local_1a8.magic;
      acVar7 = acVar17;
      goto joined_r0x001a58f9;
    }
switchD_001a57a5_caseD_0:
    this->phase = Done;
  }
  local_1a8.magic = (char  [8])&local_318;
  local_1a8.type = CONCAT31(local_1a8.type._1_3_,0x20);
  local_1a8.lmResponse.offset = (quint32)local_308;
  local_1a8.ntlmResponse.len = (quint16)((ulong)local_308 >> 0x20);
  local_1a8.ntlmResponse.maxLen = (quint16)((ulong)local_308 >> 0x30);
  QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&>::convertTo<QByteArray>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&> *)&local_1a8);
LAB_001a5945:
  if (local_308 != (char  [8])0x0) {
    LOCK();
    *(int *)local_308 = *(int *)local_308 + -1;
    UNLOCK();
    if (*(int *)local_308 == 0) {
      QArrayData::deallocate((QArrayData *)local_308,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QAuthenticatorPrivate::calculateResponse(QByteArrayView requestMethod,
                                                    QByteArrayView path, QStringView host)
{
#if !QT_CONFIG(sspi) && !QT_CONFIG(gssapi)
    Q_UNUSED(host);
#endif
    QByteArray response;
    QByteArrayView methodString;
    switch(method) {
    case QAuthenticatorPrivate::None:
        phase = Done;
        break;
    case QAuthenticatorPrivate::Basic:
        methodString = "Basic";
        response = (user + ':'_L1 + password).toLatin1().toBase64();
        phase = Done;
        break;
    case QAuthenticatorPrivate::DigestMd5:
        methodString = "Digest";
        response = digestMd5Response(challenge, requestMethod, path);
        phase = Done;
        break;
    case QAuthenticatorPrivate::Ntlm:
        methodString = "NTLM";
        if (challenge.isEmpty()) {
#if QT_CONFIG(sspi) // SSPI
            QByteArray phase1Token;
            if (user.isEmpty()) { // Only pull from system if no user was specified in authenticator
                phase1Token = qSspiStartup(this, method, host);
            } else if (!q_SSPI_library_load()) {
                // Since we're not running qSspiStartup we have to make sure the library is loaded
                qWarning("Failed to load the SSPI libraries");
                return "";
            }
            if (!phase1Token.isEmpty()) {
                response = phase1Token.toBase64();
                phase = Phase2;
            } else
#endif
            {
                response = qNtlmPhase1().toBase64();
                if (user.isEmpty())
                    phase = Done;
                else
                    phase = Phase2;
            }
        } else {
#if QT_CONFIG(sspi) // SSPI
            QByteArray phase3Token;
            if (sspiWindowsHandles)
                phase3Token = qSspiContinue(this, method, host, QByteArray::fromBase64(challenge));
            if (!phase3Token.isEmpty()) {
                response = phase3Token.toBase64();
                phase = Done;
            } else
#endif
            {
                response = qNtlmPhase3(this, QByteArray::fromBase64(challenge)).toBase64();
                phase = Done;
            }
            challenge = "";
        }

        break;
    case QAuthenticatorPrivate::Negotiate:
        methodString = "Negotiate";
        if (challenge.isEmpty()) {
            QByteArray phase1Token;
#if QT_CONFIG(sspi) // SSPI
            phase1Token = qSspiStartup(this, method, host);
#elif QT_CONFIG(gssapi) // GSSAPI
            phase1Token = qGssapiStartup(this, host);
#endif

            if (!phase1Token.isEmpty()) {
                response = phase1Token.toBase64();
                phase = Phase2;
            } else {
                phase = Done;
                return "";
            }
        } else {
            QByteArray phase3Token;
#if QT_CONFIG(sspi) // SSPI
            if (sspiWindowsHandles)
                phase3Token = qSspiContinue(this, method, host, QByteArray::fromBase64(challenge));
#elif QT_CONFIG(gssapi) // GSSAPI
            if (gssApiHandles)
                phase3Token = qGssapiContinue(this, QByteArray::fromBase64(challenge));
#endif
            if (!phase3Token.isEmpty()) {
                response = phase3Token.toBase64();
                phase = Done;
                challenge = "";
            } else {
                phase = Done;
                return "";
            }
        }

        break;
    }

    return methodString + ' ' + response;
}